

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

string * __thiscall
QPDFObjectHandle::getUniqueResourceName
          (string *__return_storage_ptr__,QPDFObjectHandle *this,string *prefix,int *min_suffix,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *namesp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint __val;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  const_iterator cVar8;
  logic_error *this_00;
  ulong uVar9;
  size_type *psVar10;
  int iVar11;
  uint __len;
  uint uVar12;
  string __str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  long *local_90 [2];
  long local_80 [2];
  uint *local_70;
  string *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_68 = prefix;
  if (namesp == (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    getResourceNames_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,this);
  }
  else {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_60,&namesp->_M_t);
  }
  iVar11 = *min_suffix;
  if ((local_60._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error
              (local_60._M_impl.super__Rb_tree_header._M_node_count);
  }
  iVar11 = iVar11 + (int)local_60._M_impl.super__Rb_tree_header._M_node_count;
  uVar12 = *min_suffix;
  local_70 = (uint *)min_suffix;
  if ((int)uVar12 <= iVar11) {
    paVar1 = &__return_storage_ptr__->field_2;
    do {
      __val = -uVar12;
      if (0 < (int)uVar12) {
        __val = uVar12;
      }
      __len = 1;
      if (9 < __val) {
        uVar9 = (ulong)__val;
        uVar5 = 4;
        do {
          __len = uVar5;
          uVar6 = (uint)uVar9;
          if (uVar6 < 100) {
            __len = __len - 2;
            goto LAB_001c5ada;
          }
          if (uVar6 < 1000) {
            __len = __len - 1;
            goto LAB_001c5ada;
          }
          if (uVar6 < 10000) goto LAB_001c5ada;
          uVar9 = uVar9 / 10000;
          uVar5 = __len + 4;
        } while (99999 < uVar6);
        __len = __len + 1;
      }
LAB_001c5ada:
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((int)uVar12 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_90[0]),__len,__val);
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_90,0,(char *)0x0,(ulong)(local_68->_M_dataplus)._M_p)
      ;
      puVar4 = local_70;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar10) {
        lVar3 = plVar7[3];
        paVar1->_M_allocated_capacity = *psVar10;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      }
      __return_storage_ptr__->_M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_60,__return_storage_ptr__);
      if ((_Rb_tree_header *)cVar8._M_node == &local_60._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_60);
        return __return_storage_ptr__;
      }
      *puVar4 = *puVar4 + 1;
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != paVar1) {
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
      }
      uVar12 = *puVar4;
    } while ((int)uVar12 <= iVar11);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"unable to find unconflicting name in QPDFObjectHandle::getUniqueResourceName")
  ;
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
QPDFObjectHandle::getUniqueResourceName(
    std::string const& prefix, int& min_suffix, std::set<std::string>* namesp) const
{
    std::set<std::string> names = (namesp ? *namesp : getResourceNames());
    int max_suffix = min_suffix + QIntC::to_int(names.size());
    while (min_suffix <= max_suffix) {
        std::string candidate = prefix + std::to_string(min_suffix);
        if (names.count(candidate) == 0) {
            return candidate;
        }
        // Increment after return; min_suffix should be the value
        // used, not the next value.
        ++min_suffix;
    }
    // This could only happen if there is a coding error.
    // The number of candidates we test is more than the
    // number of keys we're checking against.
    throw std::logic_error(
        "unable to find unconflicting name in QPDFObjectHandle::getUniqueResourceName");
}